

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake256_impl.c
# Opt level: O3

int shake256_squeeze(keccak_sponge *sponge,uint8_t *out,size_t outlen)

{
  byte *pbVar1;
  void *__src;
  int iVar2;
  ulong uVar3;
  ulong __n;
  uint8_t *state;
  
  iVar2 = -1;
  if (out != (uint8_t *)0x0 && sponge != (keccak_sponge *)0x0) {
    if ((long)outlen < 0) {
      iVar2 = -2;
    }
    else {
      uVar3 = sponge->position;
      iVar2 = 1;
      if (uVar3 < 0x88) {
        if (sponge->flags != 0x44a50aed67ba8c04) {
          if (sponge->flags != 0x53efb6b64647b401) {
            return 2;
          }
          pbVar1 = (byte *)((long)sponge->a + uVar3);
          *pbVar1 = *pbVar1 ^ 0x1f;
          pbVar1 = (byte *)((long)sponge->a + 0x87);
          *pbVar1 = *pbVar1 ^ 0x80;
          keccakf(sponge);
          sponge->position = 0;
          sponge->flags = 0x44a50aed67ba8c04;
          uVar3 = 0;
        }
        if (outlen == 0) {
LAB_001064b5:
          iVar2 = 0;
        }
        else {
          do {
            __n = 0x88 - uVar3;
            __src = (void *)((long)sponge->a + uVar3);
            if (outlen < __n) {
              memcpy(out,__src,outlen);
              sponge->position = uVar3 + outlen;
              goto LAB_001064b5;
            }
            memcpy(out,__src,__n);
            keccakf(sponge);
            out = out + __n;
            uVar3 = 0;
            iVar2 = 0;
            sponge->position = 0;
            outlen = outlen - __n;
          } while (outlen != 0);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int shake256_squeeze(keccak_sponge* const __restrict sponge,
                     uint8_t* const __restrict out,
                     const size_t outlen) {
  if (sponge == NULL) {
    return SPONGERR_NULL;
  }
  if (out == NULL) {
    return SPONGERR_NULL;
  }
  if (outlen > (SIZE_MAX >> 1)) {
    return SPONGERR_RSIZE;
  }
  if (sponge->position >= sponge_rate) {
    return SPONGERR_INVARIANT;
  }

  switch (sponge->flags) {
    case (FLAG_SQUEEZING):
      break;
    case (FLAG_ABSORBING):
      // If we're still absorbing, pad the message and apply Keccak-f.
      _shake_pad(sponge);
      sponge->flags = FLAG_SQUEEZING;
      break;
    default:
      // The sponge hasn't been initialized.
      return SPONGERR_NOTINIT;
  }

  _sponge_squeeze(sponge, out, outlen);

  return 0;
}